

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.cpp
# Opt level: O0

bool SendInt(int socket,int number)

{
  ssize_t sVar1;
  ssize_t rc;
  size_t left;
  char *data;
  int local_10;
  int number_local;
  int socket_local;
  
  rc = 4;
  local_10 = socket;
  while( true ) {
    if (rc == 0) {
      return true;
    }
    sVar1 = write(local_10,(void *)((long)&local_10 - rc),rc);
    if (sVar1 < 1) break;
    rc = rc - sVar1;
  }
  return false;
}

Assistant:

bool SendInt(int socket, int number)
{
    char * data = (char*)&number;
    size_t left = sizeof(number);
    ssize_t rc;

    while (left)
    {
        rc = write(socket, data + sizeof(number) - left, left);
        if(rc <= 0) return false;
        left -= rc;
    }

    return true;
}